

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Writer * __thiscall el::base::Writer::construct(Writer *this,int count,char *loggerIds,...)

{
  char *pcVar1;
  void *pvVar2;
  char in_AL;
  bool bVar3;
  element_type *this_00;
  reference loggerId;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_190;
  undefined1 local_158 [24];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  allocator local_a1;
  string local_a0;
  allocator local_69;
  value_type local_68;
  int local_44;
  char *pcStack_40;
  int i;
  char *id;
  va_list loggersList;
  char *loggerIds_local;
  int count_local;
  Writer *this_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  loggersList[0].reg_save_area = loggerIds;
  this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)elStorage);
  bVar3 = Storage::hasFlag(this_00,MultiLoggerSupport);
  pvVar2 = loggersList[0].reg_save_area;
  if (bVar3) {
    loggersList[0].overflow_arg_area = local_158;
    loggersList[0]._0_8_ = &stack0x00000008;
    id._4_4_ = 0x30;
    id._0_4_ = 0x18;
    pcStack_40 = (char *)loggersList[0].reg_save_area;
    utils::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->m_loggerIds,(long)count);
    for (local_44 = 0; pcVar1 = pcStack_40, local_44 < count; local_44 = local_44 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
      utils::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->m_loggerIds,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if ((uint)id < 0x29) {
        local_190 = (undefined8 *)((long)(int)(uint)id + (long)loggersList[0].overflow_arg_area);
        id._0_4_ = (uint)id + 8;
      }
      else {
        local_190 = (undefined8 *)loggersList[0]._0_8_;
        loggersList[0]._0_8_ = loggersList[0]._0_8_ + 8;
      }
      pcStack_40 = (char *)*local_190;
    }
    loggerId = utils::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->m_loggerIds,0);
    initializeLogger(this,loggerId,true,true);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,(char *)pvVar2,&local_a1);
    initializeLogger(this,&local_a0,true,true);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  MessageBuilder::initialize(&this->m_messageBuilder,this->m_logger);
  return this;
}

Assistant:

Writer& Writer::construct(int count, const char* loggerIds, ...) {
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    va_list loggersList;
    va_start(loggersList, loggerIds);
    const char* id = loggerIds;
    m_loggerIds.reserve(count);
    for (int i = 0; i < count; ++i) {
      m_loggerIds.push_back(std::string(id));
      id = va_arg(loggersList, const char*);
    }
    va_end(loggersList);
    initializeLogger(m_loggerIds.at(0));
  } else {
    initializeLogger(std::string(loggerIds));
  }
  m_messageBuilder.initialize(m_logger);
  return *this;
}